

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O0

void hashAes1Rx4<true>(void *input,size_t inputSize,void *hash)

{
  rx_vec_i128 key;
  rx_vec_i128 key_00;
  rx_vec_i128 key_01;
  rx_vec_i128 key_02;
  rx_vec_i128 key_03;
  rx_vec_i128 key_04;
  rx_vec_i128 key_05;
  rx_vec_i128 key_06;
  rx_vec_i128 key_07;
  rx_vec_i128 key_08;
  rx_vec_i128 key_09;
  rx_vec_i128 key_10;
  rx_vec_i128 in;
  rx_vec_i128 in_00;
  rx_vec_i128 in_01;
  rx_vec_i128 in_02;
  rx_vec_i128 in_03;
  rx_vec_i128 in_04;
  rx_vec_i128 in_05;
  rx_vec_i128 in_06;
  rx_vec_i128 in_07;
  rx_vec_i128 in_08;
  rx_vec_i128 in_09;
  rx_vec_i128 in_10;
  undefined8 *in_RDX;
  long in_RSI;
  ulong in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  rx_vec_i128 xkey1;
  rx_vec_i128 xkey0;
  rx_vec_i128 in3;
  rx_vec_i128 in2;
  rx_vec_i128 in1;
  rx_vec_i128 in0;
  rx_vec_i128 state3;
  rx_vec_i128 state2;
  rx_vec_i128 state1;
  rx_vec_i128 state0;
  uint8_t *inputEnd;
  uint8_t *inptr;
  longlong in_stack_fffffffffffffdd8;
  longlong lVar1;
  longlong in_stack_fffffffffffffde0;
  longlong lVar2;
  longlong in_stack_fffffffffffffde8;
  longlong lVar3;
  ulong local_178;
  
  for (local_178 = in_RDI; local_178 < in_RDI + in_RSI; local_178 = local_178 + 0x40) {
    in[1] = in_stack_fffffffffffffde8;
    in[0] = in_stack_fffffffffffffde0;
    key[1] = in_stack_fffffffffffffdd8;
    key[0] = 0x146e25;
    aesenc<true>(in,key);
    in_00[1] = in_stack_fffffffffffffde8;
    in_00[0] = in_stack_fffffffffffffde0;
    key_00[1] = in_stack_fffffffffffffdd8;
    key_00[0] = 0x146e42;
    aesdec<true>(in_00,key_00);
    in_01[1] = in_stack_fffffffffffffde8;
    in_01[0] = in_stack_fffffffffffffde0;
    key_01[1] = in_stack_fffffffffffffdd8;
    key_01[0] = 0x146e5c;
    aesenc<true>(in_01,key_01);
    in_02[1] = in_stack_fffffffffffffde8;
    in_02[0] = in_stack_fffffffffffffde0;
    key_02[1] = in_stack_fffffffffffffdd8;
    key_02[0] = 0x146e73;
    aesdec<true>(in_02,key_02);
  }
  lVar3 = -0x74db6b6009057c77;
  lVar1 = 0x51f4e03c61b263d1;
  lVar2 = -0x12e7066411efbc3a;
  in_03[1] = -0x74db6b6009057c77;
  in_03[0] = -0x12e7066411efbc3a;
  key_03[1] = 0x51f4e03c61b263d1;
  key_03[0] = 0x146f8a;
  aesenc<true>(in_03,key_03);
  in_04[1] = lVar3;
  in_04[0] = lVar2;
  key_04[1] = lVar1;
  key_04[0] = 0x146fa7;
  aesdec<true>(in_04,key_04);
  in_05[1] = lVar3;
  in_05[0] = lVar2;
  key_05[1] = lVar1;
  key_05[0] = 0x146fc1;
  aesenc<true>(in_05,key_05);
  in_06[1] = lVar3;
  in_06[0] = lVar2;
  key_06[1] = lVar1;
  key_06[0] = 0x146fd8;
  aesdec<true>(in_06,key_06);
  in_07[1] = lVar3;
  in_07[0] = lVar2;
  key_07[1] = lVar1;
  key_07[0] = 0x146ff1;
  aesenc<true>(in_07,key_07);
  in_08[1] = lVar3;
  in_08[0] = lVar2;
  key_08[1] = lVar1;
  key_08[0] = 0x14700d;
  aesdec<true>(in_08,key_08);
  in_09[1] = lVar3;
  in_09[0] = lVar2;
  key_09[1] = lVar1;
  key_09[0] = 0x147026;
  aesenc<true>(in_09,key_09);
  in_10[1] = lVar3;
  in_10[0] = lVar2;
  key_10[1] = lVar1;
  key_10[0] = 0x14703c;
  aesdec<true>(in_10,key_10);
  *in_RDX = extraout_XMM0_Qa;
  in_RDX[1] = extraout_XMM0_Qb;
  in_RDX[2] = extraout_XMM0_Qa_00;
  in_RDX[3] = extraout_XMM0_Qb_00;
  in_RDX[4] = extraout_XMM0_Qa_01;
  in_RDX[5] = extraout_XMM0_Qb_01;
  in_RDX[6] = extraout_XMM0_Qa_02;
  in_RDX[7] = extraout_XMM0_Qb_02;
  return;
}

Assistant:

void hashAes1Rx4(const void *input, size_t inputSize, void *hash) {
	assert(inputSize % 64 == 0);
	const uint8_t* inptr = (uint8_t*)input;
	const uint8_t* inputEnd = inptr + inputSize;

	rx_vec_i128 state0, state1, state2, state3;
	rx_vec_i128 in0, in1, in2, in3;

	//intial state
	state0 = rx_set_int_vec_i128(AES_HASH_1R_STATE0);
	state1 = rx_set_int_vec_i128(AES_HASH_1R_STATE1);
	state2 = rx_set_int_vec_i128(AES_HASH_1R_STATE2);
	state3 = rx_set_int_vec_i128(AES_HASH_1R_STATE3);

	//process 64 bytes at a time in 4 lanes
	while (inptr < inputEnd) {
		in0 = rx_load_vec_i128((rx_vec_i128*)inptr + 0);
		in1 = rx_load_vec_i128((rx_vec_i128*)inptr + 1);
		in2 = rx_load_vec_i128((rx_vec_i128*)inptr + 2);
		in3 = rx_load_vec_i128((rx_vec_i128*)inptr + 3);

		state0 = aesenc<softAes>(state0, in0);
		state1 = aesdec<softAes>(state1, in1);
		state2 = aesenc<softAes>(state2, in2);
		state3 = aesdec<softAes>(state3, in3);

		inptr += 64;
	}

	//two extra rounds to achieve full diffusion
	rx_vec_i128 xkey0 = rx_set_int_vec_i128(AES_HASH_1R_XKEY0);
	rx_vec_i128 xkey1 = rx_set_int_vec_i128(AES_HASH_1R_XKEY1);

	state0 = aesenc<softAes>(state0, xkey0);
	state1 = aesdec<softAes>(state1, xkey0);
	state2 = aesenc<softAes>(state2, xkey0);
	state3 = aesdec<softAes>(state3, xkey0);

	state0 = aesenc<softAes>(state0, xkey1);
	state1 = aesdec<softAes>(state1, xkey1);
	state2 = aesenc<softAes>(state2, xkey1);
	state3 = aesdec<softAes>(state3, xkey1);

	//output hash
	rx_store_vec_i128((rx_vec_i128*)hash + 0, state0);
	rx_store_vec_i128((rx_vec_i128*)hash + 1, state1);
	rx_store_vec_i128((rx_vec_i128*)hash + 2, state2);
	rx_store_vec_i128((rx_vec_i128*)hash + 3, state3);
}